

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O3

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  pointer pPVar6;
  pointer psVar7;
  pointer pLVar8;
  pointer psVar9;
  ulong uVar10;
  ulong uVar11;
  ParticleFilter *this_00;
  long lVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar13;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations_in_map_coordinates;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> map_landmarks_in_range;
  undefined1 local_138 [16];
  pointer pLStack_128;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_118;
  ParticleFilter *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Map *local_98;
  long local_90;
  double local_88;
  undefined1 local_80 [16];
  double dStack_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  void *local_48;
  
  pPVar6 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    local_f0 = 0;
    local_f8 = this;
    local_98 = map_landmarks;
    local_88 = sensor_range;
    do {
      local_90 = local_f0 * 5;
      local_d8 = pPVar6[local_f0].x;
      dStack_d0 = (&pPVar6[local_f0].x)[1];
      dVar1 = pPVar6[local_f0].theta;
      local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_finish = (LandmarkObs *)0x0;
      local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (LandmarkObs *)0x0;
      psVar7 = (map_landmarks->landmark_list).
               super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar9 = (map_landmarks->landmark_list).
               super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (psVar9 != psVar7) {
        lVar12 = 4;
        uVar11 = 0;
        do {
          uVar2 = *(undefined8 *)((long)&psVar7->id_i + lVar12);
          dVar4 = (double)(float)uVar2;
          dVar13 = (double)(float)((ulong)uVar2 >> 0x20);
          if (SQRT((dVar4 - local_d8) * (dVar4 - local_d8) +
                   (dVar13 - dStack_d0) * (dVar13 - dStack_d0)) < local_88) {
            local_138._0_4_ = *(undefined4 *)((long)psVar7 + lVar12 + -4);
            unique0x100001be = SUB84(dVar13,0);
            local_138._8_8_ = dVar4;
            unique0x100001c2 = (int)((ulong)dVar13 >> 0x20);
            if (local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
              _M_realloc_insert<LandmarkObs_const&>
                        ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_118,
                         (iterator)
                         local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(LandmarkObs *)local_138);
            }
            else {
              (local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = (double)pLStack_128;
              *(undefined8 *)
               local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish = local_138._0_8_;
              (local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = dVar4;
              local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            psVar7 = (map_landmarks->landmark_list).
                     super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar9 = (map_landmarks->landmark_list).
                     super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar11 = uVar11 + 1;
          uVar10 = ((long)psVar9 - (long)psVar7 >> 2) * -0x5555555555555555;
          lVar12 = lVar12 + 0xc;
        } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
      }
      local_138._0_8_ = (pointer)0x0;
      stack0xfffffffffffffed0 = ZEXT816(0);
      pLVar8 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_finish != pLVar8) {
        lVar12 = 0x10;
        uVar11 = 0;
        do {
          iVar3 = *(int *)((long)pLVar8 + lVar12 + -0x10);
          local_a8._8_8_ = 0;
          local_a8._0_8_ = *(ulong *)((long)pLVar8 + lVar12 + -8);
          local_e8 = *(double *)((long)&pLVar8->id + lVar12);
          uStack_e0 = 0;
          dVar4 = cos(dVar1);
          local_c8._8_4_ = extraout_XMM0_Dc;
          local_c8._0_8_ = dVar4;
          local_c8._12_4_ = extraout_XMM0_Dd;
          dVar4 = sin(dVar1);
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._0_8_ = dVar4;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          uStack_54 = local_e8._4_4_ ^ 0x80000000;
          uStack_4c = uStack_e0._4_4_ ^ 0x80000000;
          local_58 = (undefined4)local_e8;
          uStack_50 = (undefined4)uStack_e0;
          dVar4 = sin(dVar1);
          local_68._8_4_ = extraout_XMM0_Dc_01;
          local_68._0_8_ = dVar4;
          local_68._12_4_ = extraout_XMM0_Dd_01;
          dVar4 = cos(dVar1);
          dVar13 = (double)local_b8._0_8_ * (double)CONCAT44(uStack_54,local_58) +
                   (double)local_c8._0_8_ * (double)local_a8._0_8_ + local_d8;
          dVar4 = dVar4 * local_e8 + (double)local_68._0_8_ * (double)local_a8._0_8_ + dStack_d0;
          unique0x1000060e = SUB84(dVar4,0);
          local_80._8_8_ = dVar13;
          unique0x10000612 = (int)((ulong)dVar4 >> 0x20);
          local_80._0_4_ = iVar3;
          if ((pointer)local_138._8_8_ == pLStack_128) {
            std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
            _M_realloc_insert<LandmarkObs_const&>
                      ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)local_138,
                       (iterator)local_138._8_8_,(LandmarkObs *)local_80);
          }
          else {
            *(double *)(local_138._8_8_ + 0x10) = dStack_70;
            *(ulong *)local_138._8_8_ = CONCAT44(local_80._4_4_,iVar3);
            *(double *)(local_138._8_8_ + 8) = dVar13;
            local_138._8_8_ = (LandmarkObs *)(local_138._8_8_ + 0x18);
          }
          uVar11 = uVar11 + 1;
          pLVar8 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(observations->
                          super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pLVar8 >> 3) *
                   -0x5555555555555555;
          lVar12 = lVar12 + 0x18;
        } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
      }
      this_00 = (ParticleFilter *)&local_48;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_48,&local_118);
      dataAssociation(this_00,(vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_48,
                      (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_138);
      map_landmarks = local_98;
      uVar11 = local_f0;
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if (local_138._8_8_ == local_138._0_8_) {
        dVar1 = 1.0;
      }
      else {
        local_c8._8_4_ = SUB84(dStack_d0,0);
        local_c8._0_8_ = dStack_d0;
        local_c8._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
        lVar12 = 0x10;
        uVar11 = 0;
        do {
          dVar13 = *(double *)(local_138._0_8_ + lVar12 + -8) - local_d8;
          dVar1 = *(double *)((long)(int *)local_138._0_8_ + lVar12) - (double)local_c8._0_8_;
          iVar3 = *(int *)(local_138._0_8_ + lVar12 + -0x10);
          local_e8 = local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                     .super__Vector_impl_data._M_start[iVar3].x - local_d8;
          local_b8._0_8_ =
               local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3].y - (double)local_c8._0_8_;
          dVar4 = atan2(dVar1,dVar13);
          local_a8._8_4_ = extraout_XMM0_Dc_02;
          local_a8._0_8_ = dVar4;
          local_a8._12_4_ = extraout_XMM0_Dd_02;
          dVar5 = SQRT(dVar13 * dVar13 + dVar1 * dVar1) -
                  SQRT(local_e8 * local_e8 + (double)local_b8._0_8_ * (double)local_b8._0_8_);
          dVar13 = atan2((double)local_b8._0_8_,local_e8);
          dVar1 = *std_landmark;
          dVar4 = std_landmark[1];
          dVar1 = exp(-((((double)local_a8._0_8_ - dVar13) * ((double)local_a8._0_8_ - dVar13)) /
                        ((dVar4 + dVar4) * dVar4) + (dVar5 * dVar5) / ((dVar1 + dVar1) * dVar1)));
          uVar11 = uVar11 + 1;
          uVar10 = ((long)(local_138._8_8_ - local_138._0_8_) >> 3) * -0x5555555555555555;
          lVar12 = lVar12 + 0x18;
        } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
        dVar1 = dVar1 / (*std_landmark * 6.283185307179586 * std_landmark[1]);
        uVar11 = local_f0;
      }
      (&((local_f8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
         super__Vector_impl_data._M_start)->weight)[local_90] = dVar1;
      (local_f8->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = dVar1;
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_);
      }
      if (local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_f0 = uVar11 + 1;
      pPVar6 = (local_f8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar11 = ((long)(local_f8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 3) *
               -0x3333333333333333;
    } while (local_f0 <= uVar11 && uVar11 - local_f0 != 0);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(double sensor_range, double std_landmark[], std::vector<LandmarkObs> observations, Map map_landmarks) {
  std::vector<Particle> new_particles;
  std::vector<double> new_weights;
  for (int i=0; i<particles.size(); i++)
  {
    double p_x = particles[i].x;
    double p_y = particles[i].y;
    double p_theta = particles[i].theta;

    // Find map landmarks within the sensor range of the particle
    std::vector<LandmarkObs> map_landmarks_in_range;
    for (int j=0; j<map_landmarks.landmark_list.size(); j++)
    {
      int index = map_landmarks.landmark_list[j].id_i;
      double m_x = map_landmarks.landmark_list[j].x_f;
      double m_y = map_landmarks.landmark_list[j].y_f;
      if (dist(p_x, p_y, m_x, m_y) < sensor_range)
      {
        LandmarkObs l = {index, m_x, m_y};
        map_landmarks_in_range.push_back(l); 
      }
    }

    // Change observation coordinates to map coordinates
    std::vector<LandmarkObs> observations_in_map_coordinates;
    for (int j=0; j<observations.size(); j++)
    {
      int index = observations[j].id;
      double o_x = observations[j].x;
      double o_y = observations[j].y;
      double m_x = p_x + o_x * cos(p_theta) - o_y * sin(p_theta);
      double m_y = p_y + o_x * sin(p_theta) + o_y * cos(p_theta); 
      LandmarkObs l = {index, m_x, m_y};
      observations_in_map_coordinates.push_back(l); 
    }

    // Use the data association method 
    dataAssociation(map_landmarks_in_range, observations_in_map_coordinates);

    // Compute the new weight based on two vectors from point to observation and landmark
    double new_weight = 1.0; 
    for (int j=0; j<observations_in_map_coordinates.size(); j++)
    {
      double o_x = observations_in_map_coordinates[j].x - p_x;
      double o_y = observations_in_map_coordinates[j].y - p_y;
      int map_index = observations_in_map_coordinates[j].id;
      double m_x = map_landmarks_in_range[map_index].x - p_x;
      double m_y = map_landmarks_in_range[map_index].y - p_y;
      double o_length = sqrt(o_x * o_x + o_y * o_y);
      double o_angle = atan2(o_y, o_x);
      double m_length = sqrt(m_x * m_x + m_y * m_y);
      double m_angle = atan2(m_y, m_x);
      double delta_length = o_length - m_length;
      double delta_angle = o_angle - m_angle; 	

      // Bivariate Gaussian
      double num_a = delta_length * delta_length / (2.0 * std_landmark[0] * std_landmark[0]);
      double num_b = delta_angle * delta_angle / (2.0 * std_landmark[1] * std_landmark[1]);
      double numerator = exp(-1.0 * (num_a + num_b));
      double denominator = 2.0 * M_PI * std_landmark[0] * std_landmark[1];
      new_weight = numerator / denominator;
    } 
    particles[i].weight = new_weight;
    weights[i] = new_weight;
  }
}